

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O2

void TestFastDtoaPrecisionVariousDoubles(void)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  int *piVar7;
  int *piVar8;
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  Vector<char> buffer_10;
  Vector<char> buffer_11;
  Vector<char> representation;
  Vector<char> representation_00;
  Vector<char> representation_01;
  Vector<char> representation_02;
  Vector<char> representation_03;
  int *in_stack_ffffffffffffff58;
  int point;
  int length;
  char buffer_container [100];
  int *piVar5;
  int *piVar6;
  
  piVar6 = &length;
  piVar8 = &point;
  uVar2 = 100;
  buffer._8_8_ = piVar6;
  buffer.start_ = (char *)0x64;
  iVar3 = (int)buffer_container;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.0,FAST_DTOA_PRECISION|FAST_DTOA_SHORTEST_SINGLE,
                     iVar3,buffer,piVar8,in_stack_ffffffffffffff58);
  CheckHelper((char *)0xd1,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar4 = "3 >= length";
  CheckHelper((char *)0xd2,0xc19ea0,(char *)(ulong)(length < 4),(bool)uVar2);
  representation._8_8_ = pcVar4;
  representation.start_ = buffer_container;
  TrimRepresentation(representation);
  CheckEqualsHelper((char *)0xd4,0xc080e4,"1",buffer_container,(char *)piVar5,(char *)piVar7);
  CheckEqualsHelper((char *)0xd5,0xc1c254,(char *)0x1,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_00._8_8_ = piVar6;
  buffer_00.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.5,10,iVar3,buffer_00,piVar8,
                     in_stack_ffffffffffffff58);
  if (bVar1) {
    pcVar4 = "10 >= length";
    CheckHelper((char *)0xd9,0xc19eac,(char *)(ulong)(length < 0xb),(bool)uVar2);
    representation_00._8_8_ = pcVar4;
    representation_00.start_ = buffer_container;
    TrimRepresentation(representation_00);
    CheckEqualsHelper((char *)0xdb,0xc0ce47,"15",buffer_container,(char *)piVar6,(char *)piVar8);
    CheckEqualsHelper((char *)0xdc,0xc1c254,(char *)0x1,point,(char *)piVar6,(int)piVar8);
  }
  piVar6 = &length;
  piVar8 = &point;
  uVar2 = 100;
  buffer_01._8_8_ = piVar6;
  buffer_01.start_ = (char *)0x64;
  iVar3 = (int)buffer_container;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,4.94065645841247e-324,5,iVar3,buffer_01,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0xe2,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xe3,0xc0ceaa,"49407",buffer_container,(char *)piVar5,(char *)piVar7);
  CheckEqualsHelper((char *)0xe4,0xc0ce7a,(char *)0xfffffebd,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_02._8_8_ = piVar6;
  buffer_02.start_ = (char *)0x64;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.79769313486232e+308,7,iVar3,buffer_02,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0xe9,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xea,0xc0cee8,"1797693",buffer_container,(char *)piVar5,(char *)piVar7);
  CheckEqualsHelper((char *)0xeb,0xa6153b,(char *)0x135,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_03._8_8_ = piVar6;
  buffer_03.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,4294967272.0,0xe,iVar3,buffer_03,piVar8,
                     in_stack_ffffffffffffff58);
  if (bVar1) {
    pcVar4 = "14 >= length";
    CheckHelper((char *)0xf0,0xc19eb9,(char *)(ulong)(length < 0xf),(bool)uVar2);
    representation_01._8_8_ = pcVar4;
    representation_01.start_ = buffer_container;
    TrimRepresentation(representation_01);
    CheckEqualsHelper((char *)0xf2,0xc0cefa,"4294967272",buffer_container,(char *)piVar6,
                      (char *)piVar8);
    CheckEqualsHelper((char *)0xf3,0xc0df44,(char *)0xa,point,(char *)piVar6,(int)piVar8);
  }
  piVar6 = &length;
  piVar8 = &point;
  uVar2 = 100;
  buffer_04._8_8_ = piVar6;
  buffer_04.start_ = (char *)0x64;
  iVar3 = (int)buffer_container;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,4.185580496821357e+298,0x11,iVar3,buffer_04,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0xf8,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xf9,0xc19ec6,"41855804968213567",buffer_container,(char *)piVar5,
                    (char *)piVar7);
  CheckEqualsHelper((char *)0xfa,0xaf8c1d,(char *)0x12b,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_05._8_8_ = piVar6;
  buffer_05.start_ = (char *)0x64;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,5.562684646268003e-309,FAST_DTOA_SHORTEST_SINGLE,iVar3
                     ,buffer_05,piVar8,in_stack_ffffffffffffff58);
  CheckHelper((char *)0xfe,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xff,0xc0cfda,"6",buffer_container,(char *)piVar5,(char *)piVar7);
  CheckEqualsHelper((char *)0x100,0xc1fb9c,(char *)0xfffffecc,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_06._8_8_ = piVar6;
  buffer_06.start_ = (char *)0x64;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,2147483648.0,5,iVar3,buffer_06,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0x104,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x105,0xc0d00e,"21475",buffer_container,(char *)piVar5,(char *)piVar7);
  CheckEqualsHelper((char *)0x106,0xc0df44,(char *)0xa,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_07._8_8_ = piVar6;
  buffer_07.start_ = (char *)0x64;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,3.5844466002796428e+298,10,iVar3,buffer_07,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0x10a,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar4 = "10 >= length";
  CheckHelper((char *)0x10b,0xc19eac,(char *)(ulong)(length < 0xb),(bool)uVar2);
  representation_02._8_8_ = pcVar4;
  representation_02.start_ = buffer_container;
  TrimRepresentation(representation_02);
  CheckEqualsHelper((char *)0x10d,0xc0d03c,"35844466",buffer_container,(char *)piVar5,(char *)piVar7
                   );
  CheckEqualsHelper((char *)0x10e,0xaf8c1d,(char *)0x12b,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_08._8_8_ = piVar6;
  buffer_08.start_ = (char *)0x64;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,2.2250738585072014e-308,0x11,iVar3,buffer_08,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0x113,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x114,0xc0d050,"22250738585072014",buffer_container,(char *)piVar5,
                    (char *)piVar7);
  CheckEqualsHelper((char *)0x115,0xc0d076,(char *)0xfffffecd,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_09._8_8_ = piVar6;
  buffer_09.start_ = (char *)0x64;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,2.225073858507201e-308,0x11,iVar3,buffer_09,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0x11a,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar4 = "20 >= length";
  CheckHelper((char *)0x11b,0xc19eec,(char *)(ulong)(length < 0x15),(bool)uVar2);
  representation_03._8_8_ = pcVar4;
  representation_03.start_ = buffer_container;
  TrimRepresentation(representation_03);
  CheckEqualsHelper((char *)0x11d,0xc19ef9,"22250738585072009",buffer_container,(char *)piVar5,
                    (char *)piVar7);
  CheckEqualsHelper((char *)0x11e,0xc0d076,(char *)0xfffffecd,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_10._8_8_ = piVar6;
  buffer_10.start_ = (char *)0x64;
  piVar5 = piVar6;
  piVar7 = piVar8;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,3.316133905216739e-237,0x12,iVar3,buffer_10,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0x122,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x123,0xc19f1f,"331613390521673906",buffer_container,(char *)piVar5,
                    (char *)piVar7);
  CheckEqualsHelper((char *)0x124,0xc0d18c,(char *)0xffffff14,point,(char *)piVar5,(int)piVar7);
  uVar2 = 100;
  buffer_11._8_8_ = piVar6;
  buffer_11.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,7.98851839160081e+191,4,iVar3,buffer_11,piVar8,
                     in_stack_ffffffffffffff58);
  CheckHelper((char *)0x128,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x129,0xc0d1a1,"7989",buffer_container,(char *)piVar6,(char *)piVar8);
  CheckEqualsHelper((char *)0x12a,0xa06cca,(char *)0xc0,point,(char *)piVar6,(int)piVar8);
  return;
}

Assistant:

TEST(FastDtoaPrecisionVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  status = FastDtoa(1.0, FAST_DTOA_PRECISION, 3, buffer, &length, &point);
  CHECK(status);
  CHECK(3 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  status = FastDtoa(1.5, FAST_DTOA_PRECISION, 10, buffer, &length, &point);
  if (status) {
    CHECK(10 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("15", buffer.start());
    CHECK_EQ(1, point);
  }

  double min_double = 5e-324;
  status = FastDtoa(min_double, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("49407", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  status = FastDtoa(max_double, FAST_DTOA_PRECISION, 7,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("1797693", buffer.start());
  CHECK_EQ(309, point);

  status = FastDtoa(4294967272.0, FAST_DTOA_PRECISION, 14,
                    buffer, &length, &point);
  if (status) {
    CHECK(14 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("4294967272", buffer.start());
    CHECK_EQ(10, point);
  }

  status = FastDtoa(4.1855804968213567e298, FAST_DTOA_PRECISION, 17,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("41855804968213567", buffer.start());
  CHECK_EQ(299, point);

  status = FastDtoa(5.5626846462680035e-309, FAST_DTOA_PRECISION, 1,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("6", buffer.start());
  CHECK_EQ(-308, point);

  status = FastDtoa(2147483648.0, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("21475", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.5844466002796428e+298, FAST_DTOA_PRECISION, 10,
                    buffer, &length, &point);
  CHECK(status);
  CHECK(10 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("35844466", buffer.start());
  CHECK_EQ(299, point);

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("22250738585072014", buffer.start());
  CHECK_EQ(-307, point);

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK(20 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("22250738585072009", buffer.start());
  CHECK_EQ(-307, point);

  v = 3.3161339052167390562200598e-237;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 18, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("331613390521673906", buffer.start());
  CHECK_EQ(-236, point);

  v = 7.9885183916008099497815232e+191;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 4, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("7989", buffer.start());
  CHECK_EQ(192, point);
}